

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_allocator.hpp
# Opt level: O1

void __thiscall
Al::internal::
CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
::clear(CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
        *this)

{
  pointer pvVar1;
  pointer ppvVar2;
  int iVar3;
  void **ptr;
  pointer ppvVar4;
  size_t bin;
  long lVar5;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar3 == 0) {
    lVar5 = 0;
    do {
      pvVar1 = (this->free_data).
               super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppvVar2 = *(pointer *)
                 ((long)&pvVar1[lVar5].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl +
                 8);
      for (ppvVar4 = *(pointer *)
                      &pvVar1[lVar5].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl;
          ppvVar4 != ppvVar2; ppvVar4 = ppvVar4 + 1) {
        free(*ppvVar4);
      }
      pvVar1 = (this->free_data).
               super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppvVar4 = *(pointer *)
                 &pvVar1[lVar5].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl;
      if (*(pointer *)
           ((long)&pvVar1[lVar5].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl + 8) !=
          ppvVar4) {
        *(pointer *)
         ((long)&pvVar1[lVar5].super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl + 8) =
             ppvVar4;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x3d);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void clear() {
    std::lock_guard<std::mutex> lg(mutex);
    for (size_t bin = 0; bin < bin_sizes.size(); ++bin) {
      for (auto&& ptr : free_data[bin]) {
        allocator.deallocate(ptr);
      }
      free_data[bin].clear();
    }
  }